

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O3

int INT_CMwrite_evcontrol(CMConnection conn,uchar type,int argument)

{
  int iVar1;
  size_t in_R8;
  int evcontrol_header [2];
  FFSEncodeVec static_vec [3];
  int local_44;
  ulong local_40;
  FFSEncodeVec local_38;
  FFSEncodeVec local_28;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_28.iov_base = &local_44;
  local_38.iov_base = &local_40;
  local_38.iov_len = 8;
  local_28.iov_len = 4;
  local_18 = 0;
  uStack_10 = 0;
  local_40 = CONCAT44((uint)type << 0x18,0x45564300) | 0xc00000000;
  local_44 = argument;
  iVar1 = INT_CMwrite_raw_notify
                    (conn,&local_38,&local_28,2,in_R8,(attr_list)0x0,1,(CMcompletion_notify_func)0x0
                     ,(void *)0x0);
  return iVar1;
}

Assistant:

extern int
 INT_CMwrite_evcontrol(CMConnection conn, unsigned char type, int argument) {
     int evcontrol_header[2] = {0x45564300, 0};
     struct FFSEncodeVec static_vec[3];
     int success;
     FFSEncodeVector vec = &static_vec[0];
     assert(sizeof(int) == 4);
     vec[0].iov_base = evcontrol_header;
     vec[0].iov_len = sizeof(evcontrol_header);
     vec[1].iov_base = &argument; /* XXX int size */
     vec[1].iov_len = sizeof(int);
     vec[2].iov_base = NULL;
     vec[2].iov_len = 0;
     evcontrol_header[1] = type << 24 | (sizeof(evcontrol_header) + sizeof(int));
     success = INT_CMwrite_raw(conn, vec, vec + 1, 2, evcontrol_header[1] & 0xffffff, NULL, 1) != 0;
     return success;
 }